

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_info::torrent_info(torrent_info *this,string *filename,load_torrent_limits *cfg)

{
  vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_> *pvVar1;
  bool bVar2;
  int iVar3;
  span<const_char> buffer;
  error_code ec;
  vector<char,_std::allocator<char>_> buf;
  bdecode_node e;
  int in_stack_ffffffffffffff20;
  error_code local_d8 [5];
  undefined1 local_88 [16];
  pointer local_78;
  bdecode_node local_70;
  
  file_storage::file_storage(&this->m_files);
  memset(&this->m_orig_files,0,0xf0);
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  pvVar1 = &(this->m_info_dict).m_tokens;
  (pvVar1->
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_info_dict).m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_info_dict).m_root_tokens + 4) = (undefined1  [16])0x0;
  (this->m_info_dict).m_token_idx = -1;
  (this->m_info_dict).m_last_index = -1;
  (this->m_info_dict).m_last_token = -1;
  (this->m_info_dict).m_size = -1;
  this->m_creation_date = 0;
  info_hash_t::info_hash_t(&this->m_info_hash);
  (this->m_flags).m_val = '\0';
  this->m_piece_hashes = 0;
  this->m_info_section_size = 0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  local_d8[0].val_ = 0;
  local_d8[0].failed_ = false;
  local_d8[0].cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  iVar3 = anon_unknown_1::load_file
                    (filename,(vector<char,_std::allocator<char>_> *)local_88,local_d8,
                     cfg->max_buffer_size);
  if (iVar3 < 0) {
    aux::throw_ex<boost::system::system_error,boost::system::error_code&>(local_d8);
  }
  buffer.m_ptr = (char *)(local_88._8_8_ + -local_88._0_8_);
  buffer.m_len = (difference_type)local_d8;
  bdecode(&local_70,(libtorrent *)local_88._0_8_,buffer,(error_code *)0x0,
          (int *)(ulong)(uint)cfg->max_decode_depth,cfg->max_decode_tokens,in_stack_ffffffffffffff20
         );
  if (local_d8[0].failed_ == false) {
    bVar2 = parse_torrent_file(this,&local_70,local_d8,cfg);
    if (bVar2) {
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&local_70);
      ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_88);
      return;
    }
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>(local_d8);
}

Assistant:

torrent_info::torrent_info(std::string const& filename
		, load_torrent_limits const& cfg)
	{
		std::vector<char> buf;
		error_code ec;
		int ret = load_file(filename, buf, ec, cfg.max_buffer_size);
		if (ret < 0) aux::throw_ex<system_error>(ec);

		bdecode_node e = bdecode(buf, ec, nullptr, cfg.max_decode_depth
			, cfg.max_decode_tokens);
		if (ec) aux::throw_ex<system_error>(ec);

		if (!parse_torrent_file(e, ec, cfg))
			aux::throw_ex<system_error>(ec);

		INVARIANT_CHECK;
	}